

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

void __thiscall
Query::prefetch(Query *this,int from_index,int howmany,bool only_last,PrefetchFunc *prefetcher)

{
  pointer pQVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)howmany;
  if (howmany < 1) {
    uVar4 = uVar3;
  }
  lVar2 = (long)from_index * 0x48;
  for (; (uVar4 != uVar3 &&
         (pQVar1 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (long)from_index + uVar3 <
         (ulong)(((long)(this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pQVar1) / 0x48)));
      uVar3 = uVar3 + 1) {
    if ((*(int *)((long)&pQVar1->type + lVar2) == 1) &&
       ((ulong)(uint)howmany - 1 == uVar3 || !only_last)) {
      std::function<void_(PrimitiveQuery)>::operator()
                (prefetcher,*(PrimitiveQuery *)((long)&(pQVar1->ngram).itype + lVar2));
    }
    lVar2 = lVar2 + 0x48;
  }
  return;
}

Assistant:

void Query::prefetch(int from_index, int howmany, bool only_last,
                     const PrefetchFunc &prefetcher) const {
    for (int i = 0; i < howmany; i++) {
        int ndx = i + from_index;
        if (ndx >= queries.size()) {
            break;
        }
        if (queries[ndx].type == QueryType::PRIMITIVE) {
            if (only_last && (i + 1 != howmany)) {
                continue;
            }
            prefetcher(queries[ndx].ngram);
        }
    }
}